

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O1

big_integer * anon_unknown.dwarf_cd9f::rand_big(big_integer *__return_storage_ptr__,size_t size)

{
  int iVar1;
  big_integer local_38;
  
  iVar1 = rand();
  big_integer::big_integer(__return_storage_ptr__,iVar1);
  if (size != 0) {
    do {
      big_integer::big_integer(&local_38,0x7fffffff);
      big_integer::operator*=(__return_storage_ptr__,&local_38);
      if (local_38.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_38.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      iVar1 = rand();
      big_integer::big_integer(&local_38,iVar1);
      big_integer::operator+=(__return_storage_ptr__,&local_38);
      if (local_38.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_38.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      size = size - 1;
    } while (size != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

big_integer rand_big(size_t size) {
        big_integer result = rand();

        for (size_t i = 0; i != size; ++i) {
            result *= RAND_MAX;
            result += rand();
        }

        return result;
    }